

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int INT_CMwrite_evcontrol(CMConnection conn,uchar type,int argument)

{
  int iVar1;
  int argument_local;
  int evcontrol_header [2];
  FFSEncodeVec static_vec [3];
  
  static_vec[1].iov_base = &argument_local;
  static_vec[0].iov_base = evcontrol_header;
  static_vec[0].iov_len = 8;
  static_vec[1].iov_len = 4;
  static_vec[2].iov_base = (void *)0x0;
  static_vec[2].iov_len = 0;
  evcontrol_header = (int  [2])(CONCAT44((uint)type << 0x18,0x45564300) | 0xc00000000);
  argument_local = argument;
  iVar1 = INT_CMwrite_raw(conn,static_vec,static_vec + 1,2,0xc,(attr_list)0x0,1);
  return iVar1;
}

Assistant:

extern int
 INT_CMwrite_evcontrol(CMConnection conn, unsigned char type, int argument) {
     int evcontrol_header[2] = {0x45564300, 0};
     struct FFSEncodeVec static_vec[3];
     int success;
     FFSEncodeVector vec = &static_vec[0];
     assert(sizeof(int) == 4);
     vec[0].iov_base = evcontrol_header;
     vec[0].iov_len = sizeof(evcontrol_header);
     vec[1].iov_base = &argument; /* XXX int size */
     vec[1].iov_len = sizeof(int);
     vec[2].iov_base = NULL;
     vec[2].iov_len = 0;
     evcontrol_header[1] = type << 24 | (sizeof(evcontrol_header) + sizeof(int));
     success = INT_CMwrite_raw(conn, vec, vec + 1, 2, evcontrol_header[1] & 0xffffff, NULL, 1) != 0;
     return success;
 }